

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void I422AlphaToARGBRow_C
               (uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *src_a,uint8_t *rgb_buf,
               YuvConstants *yuvconstants,int width)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  for (iVar1 = 0; iVar1 < width + -1; iVar1 = iVar1 + 2) {
    libyuv::YuvPixel(src_y[lVar2 * 2],src_u[lVar2],src_v[lVar2],rgb_buf,rgb_buf + 1,rgb_buf + 2,
                     yuvconstants);
    rgb_buf[3] = src_a[lVar2 * 2];
    libyuv::YuvPixel(src_y[lVar2 * 2 + 1],src_u[lVar2],src_v[lVar2],rgb_buf + 4,rgb_buf + 5,
                     rgb_buf + 6,yuvconstants);
    rgb_buf[7] = src_a[lVar2 * 2 + 1];
    rgb_buf = rgb_buf + 8;
    lVar2 = lVar2 + 1;
  }
  if ((width & 1U) != 0) {
    libyuv::YuvPixel(src_y[lVar2 * 2],src_u[lVar2],src_v[lVar2],rgb_buf,rgb_buf + 1,rgb_buf + 2,
                     yuvconstants);
    rgb_buf[3] = src_a[lVar2 * 2];
  }
  return;
}

Assistant:

void I422AlphaToARGBRow_C(const uint8_t* src_y,
                          const uint8_t* src_u,
                          const uint8_t* src_v,
                          const uint8_t* src_a,
                          uint8_t* rgb_buf,
                          const struct YuvConstants* yuvconstants,
                          int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = src_a[0];
    YuvPixel(src_y[1], src_u[0], src_v[0], rgb_buf + 4, rgb_buf + 5,
             rgb_buf + 6, yuvconstants);
    rgb_buf[7] = src_a[1];
    src_y += 2;
    src_u += 1;
    src_v += 1;
    src_a += 2;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = src_a[0];
  }
}